

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,char *context_string)

{
  ptls_async_job_t **pppVar1;
  st_ptls_message_emitter_t *psVar2;
  st_ptls_sign_certificate_t *psVar3;
  bool bVar4;
  ptls_iovec_t pVar5;
  ptls_buffer_t *ppVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ptls_async_job_t **pppVar11;
  ptls_async_job_t **pppVar12;
  size_t sVar13;
  ptls_hash_context_t **pppVar14;
  ptls_key_schedule_t *ppVar15;
  size_t sVar16;
  uint8_t *puVar17;
  uint16_t algo;
  uint8_t data [226];
  uint8_t local_162;
  uint8_t local_161;
  ptls_buffer_t *local_160;
  ptls_buffer_t *local_158;
  ptls_key_schedule_t *local_150;
  st_ptls_message_emitter_t *local_148;
  size_t local_140;
  size_t local_138;
  size_t local_130;
  uint8_t *local_128;
  size_t sStack_120;
  uint8_t local_118 [232];
  
  if (tls->ctx->sign_certificate == (ptls_sign_certificate_t *)0x0) {
    return 0;
  }
  psVar2 = (st_ptls_message_emitter_t *)emitter->buf->off;
  iVar7 = (*emitter->begin_message)(emitter);
  if (iVar7 != 0) {
    return iVar7;
  }
  local_160 = emitter->buf;
  ppVar15 = tls->key_schedule;
  local_130 = local_160->off;
  local_148 = psVar2;
  iVar7 = ptls_buffer_reserve_aligned(local_160,1,'\0');
  if (iVar7 == 0) {
    local_160->base[local_160->off] = '\x0f';
    local_160->off = local_160->off + 1;
    iVar7 = 0;
  }
  if (iVar7 == 0) {
    iVar7 = ptls_buffer_reserve_aligned(local_160,3,'\0');
    if (iVar7 == 0) {
      puVar17 = local_160->base;
      sVar13 = local_160->off;
      puVar17[sVar13 + 2] = '\0';
      puVar17 = puVar17 + sVar13;
      puVar17[0] = '\0';
      puVar17[1] = '\0';
      local_160->off = local_160->off + 3;
      iVar7 = 0;
    }
    if (iVar7 == 0) {
      sVar13 = local_160->off;
      local_158 = emitter->buf;
      local_138 = local_158->off;
      local_150 = ppVar15;
      iVar7 = ptls_buffer_reserve_aligned(local_158,2,'\0');
      if (iVar7 == 0) {
        puVar17 = local_158->base;
        sVar16 = local_158->off;
        (puVar17 + sVar16)[0] = '\0';
        (puVar17 + sVar16)[1] = '\0';
        local_158->off = local_158->off + 2;
        iVar7 = 0;
      }
      bVar4 = iVar7 != 0;
      if (iVar7 == 0) {
        iVar7 = ptls_buffer_reserve_aligned(local_158,2,'\0');
        if (iVar7 == 0) {
          puVar17 = local_158->base;
          sVar16 = local_158->off;
          (puVar17 + sVar16)[0] = '\0';
          (puVar17 + sVar16)[1] = '\0';
          local_158->off = local_158->off + 2;
          iVar7 = 0;
        }
        bVar4 = true;
        if (iVar7 == 0) {
          local_140 = local_158->off;
          sStack_120 = build_certificate_verify_signdata(local_118,tls->key_schedule,context_string)
          ;
          ppVar6 = local_158;
          psVar3 = tls->ctx->sign_certificate;
          pppVar11 = (ptls_async_job_t **)0x0;
          pppVar1 = &(tls->field_19).server.async_job;
          pppVar12 = pppVar1;
          if ((tls->field_0x1e8 & 1) == 0) {
            pppVar12 = pppVar11;
          }
          if (signature_algorithms != (st_ptls_signature_algorithms_t *)0x0) {
            pppVar11 = (ptls_async_job_t **)signature_algorithms->count;
          }
          pVar5.len = sStack_120;
          pVar5.base = local_118;
          local_128 = local_118;
          iVar8 = (*psVar3->cb)(psVar3,tls,pppVar12,(uint16_t *)&local_162,local_158,pVar5,
                                signature_algorithms->list,(size_t)pppVar11);
          if (iVar8 == 0) {
            if (*pppVar1 != (ptls_async_job_t *)0x0) {
              __assert_fail("tls->server.async_job == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                            ,0xc92,
                            "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                           );
            }
            ppVar6->base[local_138] = local_161;
            ppVar6->base[local_138 + 1] = local_162;
            bVar4 = false;
          }
          else if (iVar8 == 0x20b) {
            if ((tls->field_0x1e8 & 1) == 0) {
              __assert_fail("tls->is_server || !\"async operation only supported on the server-side\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                            ,0xc88,
                            "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                           );
            }
            if (*pppVar1 == (ptls_async_job_t *)0x0) {
              __assert_fail("tls->server.async_job != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                            ,0xc89,
                            "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                           );
            }
            emitter->buf->off = (size_t)local_148;
            bVar4 = true;
          }
          else {
            bVar4 = true;
            if (*pppVar1 != (ptls_async_job_t *)0x0) {
              __assert_fail("tls->server.async_job == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                            ,0xc8e,
                            "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                           );
            }
          }
          iVar7 = iVar8;
          if (iVar8 == 0) {
            uVar9 = ppVar6->off - local_140;
            iVar7 = 0x20c;
            bVar4 = true;
            if (uVar9 < 0x10000) {
              lVar10 = 8;
              sVar16 = local_140;
              do {
                local_158->base[sVar16 - 2] = (uint8_t)(uVar9 >> ((byte)lVar10 & 0x3f));
                lVar10 = lVar10 + -8;
                sVar16 = sVar16 + 1;
                bVar4 = false;
                iVar7 = iVar8;
              } while (lVar10 != -8);
            }
          }
        }
      }
      ppVar15 = local_150;
      if (!bVar4) {
        uVar9 = local_160->off - sVar13;
        if (uVar9 < 0x1000000) {
          lVar10 = 0x10;
          do {
            local_160->base[sVar13 - 3] = (uint8_t)(uVar9 >> ((byte)lVar10 & 0x3f));
            lVar10 = lVar10 + -8;
            sVar13 = sVar13 + 1;
          } while (lVar10 != -8);
          bVar4 = true;
          goto LAB_0011c9b7;
        }
        iVar7 = 0x20c;
      }
      bVar4 = false;
    }
    else {
      bVar4 = false;
    }
LAB_0011c9b7:
    if (bVar4) {
      bVar4 = true;
      if ((ppVar15 != (ptls_key_schedule_t *)0x0) && (ppVar15->num_hashes != 0)) {
        puVar17 = local_160->base + local_130;
        sVar16 = local_160->off - local_130;
        pppVar14 = &ppVar15->hashes[0].ctx;
        sVar13 = 0;
        local_148 = emitter;
        do {
          (*(*pppVar14)->update)(*pppVar14,puVar17,sVar16);
          sVar13 = sVar13 + 1;
          pppVar14 = pppVar14 + 3;
        } while (sVar13 != ppVar15->num_hashes);
        bVar4 = true;
        emitter = local_148;
      }
      goto LAB_0011ca13;
    }
  }
  bVar4 = false;
LAB_0011ca13:
  if (bVar4) {
    iVar7 = (*emitter->commit_message)(emitter);
  }
  return iVar7;
}

Assistant:

static int send_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                   struct st_ptls_signature_algorithms_t *signature_algorithms, const char *context_string)
{
    size_t start_off = emitter->buf->off;
    int ret;

    if (tls->ctx->sign_certificate == NULL)
        return 0;
    /* build and send CertificateVerify */
    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
        ptls_buffer_t *sendbuf = emitter->buf;
        size_t algo_off = sendbuf->off;
        ptls_buffer_push16(sendbuf, 0); /* filled in later */
        ptls_buffer_push_block(sendbuf, 2, {
            uint16_t algo;
            uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
            size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
            if ((ret = tls->ctx->sign_certificate->cb(
                     tls->ctx->sign_certificate, tls, tls->is_server ? &tls->server.async_job : NULL, &algo, sendbuf,
                     ptls_iovec_init(data, datalen), signature_algorithms != NULL ? signature_algorithms->list : NULL,
                     signature_algorithms != NULL ? signature_algorithms->count : 0)) != 0) {
                if (ret == PTLS_ERROR_ASYNC_OPERATION) {
                    assert(tls->is_server || !"async operation only supported on the server-side");
                    assert(tls->server.async_job != NULL);
                    /* Reset the output to the end of the previous handshake message. CertificateVerify will be rebuilt when the
                     * async operation completes. */
                    emitter->buf->off = start_off;
                } else {
                    assert(tls->server.async_job == NULL);
                }
                goto Exit;
            }
            assert(tls->server.async_job == NULL);
            sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
            sendbuf->base[algo_off + 1] = (uint8_t)algo;
        });
    });
Exit:
    return ret;
}